

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

uint32_t seekWaveToData(FILE *waveFile,WaveFmt *fmt)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  long lVar6;
  uint uVar7;
  uint32_t chunkSize;
  long chunkStart;
  char local_2d;
  uint32_t fileLength;
  char waveHeader [13];
  WaveFmt *fmt_local;
  FILE *waveFile_local;
  
  waveHeader._5_8_ = fmt;
  memset(&local_2d,0,0xd);
  fread(&local_2d,0xc,1,(FILE *)waveFile);
  uVar4 = stack0xffffffffffffffd7 & 0xff;
  uVar1 = stack0xffffffffffffffd7 >> 8;
  uVar2 = stack0xffffffffffffffd7 >> 0x10;
  uVar7 = stack0xffffffffffffffd7 & 0xff000000;
  stack0xffffffffffffffd7 = stack0xffffffffffffffd7 & 0xffffff00;
  iVar5 = strcmp(&local_2d,"RIFF");
  if ((iVar5 != 0) || (iVar5 = strcmp(waveHeader,"WAVE"), iVar5 != 0)) {
    die("not a valid wave file");
  }
  do {
    lVar6 = ftell((FILE *)waveFile);
    if ((long)(ulong)(uVar4 + 8 | (uVar1 & 0xff) << 8 | (uVar2 & 0xff) << 0x10 | uVar7) <= lVar6) {
      die("data chunk not found!");
      return 0xffffffff;
    }
    fread(&local_2d,8,1,(FILE *)waveFile);
    lVar6 = ftell((FILE *)waveFile);
    uVar3 = stack0xffffffffffffffd7;
    stack0xffffffffffffffd7 = stack0xffffffffffffffd7 & 0xffffff00;
    iVar5 = strcmp(&local_2d,"fmt ");
    if (iVar5 == 0) {
      fread((void *)waveHeader._5_8_,0x10,1,(FILE *)waveFile);
      if ((*(char *)waveHeader._5_8_ != '\x01') || (*(char *)(waveHeader._5_8_ + 1) != '\0')) {
        die("only PCM audio is supported (audio format is 0x%2x%2x)",
            (ulong)*(byte *)(waveHeader._5_8_ + 1),(ulong)*(byte *)waveHeader._5_8_);
      }
      if ((uint)*(byte *)(waveHeader._5_8_ + 0xe) % 8 != 0) {
        die("only 8, 16, 24 bit audio supported (audio file is %d bits)",
            (ulong)*(byte *)(waveHeader._5_8_ + 0xe));
      }
    }
    else {
      iVar5 = strcmp(&local_2d,"data");
      if (iVar5 == 0) {
        printf("data chunk found at %ld\n",lVar6);
        return uVar3;
      }
    }
    fseek((FILE *)waveFile,lVar6 + (ulong)uVar3,0);
  } while( true );
}

Assistant:

uint32_t seekWaveToData(FILE* waveFile, struct WaveFmt *fmt){
	char waveHeader[13] = {0};
	uint32_t fileLength;
	long chunkStart;
	uint32_t chunkSize;

	fread(waveHeader, 12, 1, waveFile);
	fileLength = 8 + ((uint32_t)(uint8_t)waveHeader[4]) | 
		(((uint32_t)(uint8_t)waveHeader[5]) << 8) | 
		(((uint32_t)(uint8_t)waveHeader[6]) << 16) | 
		(((uint32_t)(uint8_t)waveHeader[7]) << 24);
	waveHeader[4] = 0;
	if(strcmp(&waveHeader[0], "RIFF") != 0 || strcmp(&waveHeader[8], "WAVE") != 0){
		die("not a valid wave file");
	}

	while(ftell(waveFile) < fileLength){
		fread(waveHeader, 8, 1, waveFile);
		chunkStart = ftell(waveFile);
		chunkSize = ((uint32_t)(uint8_t)waveHeader[4]) | 
			(((uint32_t)(uint8_t)waveHeader[5]) << 8) | 
			(((uint32_t)(uint8_t)waveHeader[6]) << 16) | 
			(((uint32_t)(uint8_t)waveHeader[7]) << 24);
		waveHeader[4] = 0;
		if(!strcmp(&waveHeader[0], "fmt ")){
			fread(fmt, 16, 1, waveFile);
			if(fmt->audio_format[0] != 1 || fmt->audio_format[1] != 0)
				die("only PCM audio is supported (audio format is 0x%2x%2x)", fmt->audio_format[1], fmt->audio_format[0]);
			if(fmt->bits_per_sample[0] % 8 != 0)
				die("only 8, 16, 24 bit audio supported (audio file is %d bits)", fmt->bits_per_sample[0]);
		}else if(!strcmp(&waveHeader[0], "data")){
			printf("data chunk found at %ld\n", chunkStart);
			return chunkSize;
		}
		fseek(waveFile, chunkStart + chunkSize, SEEK_SET);
	}

	die("data chunk not found!");
	return -1;
}